

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  long *plVar6;
  SelectionVector *count;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var9;
  undefined8 uVar10;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var11;
  sel_t *psVar12;
  undefined8 uVar13;
  byte bVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  reference vector;
  reference vector_00;
  long lVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  SelectionVector *pSVar19;
  SelectionVector *pSVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  ulong uVar22;
  data_ptr_t pdVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  SelectionVector *pSVar26;
  idx_t idx_in_entry;
  ulong uVar27;
  data_ptr_t pdVar28;
  UnifiedVectorFormat ldata;
  data_ptr_t local_130;
  ulong local_128;
  UnifiedVectorFormat local_e8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar6 = (long *)result->data;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      lVar17 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined8 *)vector_00->data,&result->validity,0);
      *plVar6 = lVar17;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar7 = vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar28 = vector->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar23 = local_e8.data;
          pSVar26 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar26;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar23;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar22 = 0;
            pSVar26 = (SelectionVector *)0x0;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_01ad1e70:
                pSVar20 = pSVar26;
                if (pSVar26 < pSVar19) {
                  uVar10 = *(undefined8 *)pdVar7;
                  pdVar23 = pdVar28 + (long)pSVar26 * 0x10 + 8;
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (*(undefined8 *)(pdVar23 + -8),*(undefined8 *)pdVar23,uVar10,
                                        pVVar1,pSVar26);
                    *(long *)(pdVar25 + (long)pSVar26 * 8) = lVar17;
                    pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
                    pdVar23 = pdVar23 + 0x10;
                    pSVar20 = pSVar19;
                  } while (pSVar19 != pSVar26);
                }
              }
              else {
                uVar27 = puVar5[uVar22];
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar20 = pSVar19;
                if (uVar27 != 0) {
                  if (uVar27 == 0xffffffffffffffff) goto LAB_01ad1e70;
                  pSVar20 = pSVar26;
                  if (pSVar26 < pSVar19) {
                    pdVar23 = pdVar28 + (long)pSVar26 * 0x10 + 8;
                    uVar24 = 0;
                    do {
                      if ((uVar27 >> (uVar24 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                           (*(undefined8 *)(pdVar23 + -8),*(undefined8 *)pdVar23,
                                            *(undefined8 *)pdVar7,pVVar1,
                                            (long)&pSVar26->sel_vector + uVar24);
                        *(long *)(pdVar25 + uVar24 * 8 + (long)pSVar26 * 8) = lVar17;
                      }
                      uVar24 = uVar24 + 1;
                      pdVar23 = pdVar23 + 0x10;
                      pSVar20 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar26 != uVar24);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pSVar26 = pSVar20;
              if (uVar22 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar7;
        pdVar28 = pdVar28 + 8;
        pSVar26 = (SelectionVector *)0x0;
        do {
          lVar17 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                             (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,uVar10,pVVar1,
                              pSVar26);
          *(long *)(pdVar25 + (long)pSVar26 * 8) = lVar17;
          pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
          pdVar28 = pdVar28 + 0x10;
        } while (count != pSVar26);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_e8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_e8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var11._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar12 = (local_78.sel)->sel_vector;
              pSVar26 = (SelectionVector *)0x0;
              do {
                pSVar19 = pSVar26;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var11._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar19 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var11._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar26 * 4);
                }
                pSVar20 = pSVar26;
                if (psVar12 != (sel_t *)0x0) {
                  pSVar20 = (SelectionVector *)(ulong)psVar12[(long)pSVar26];
                }
                uVar13._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar19 * 0x10))->_M_use_count;
                uVar13._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar19 * 0x10))->_M_weak_count;
                lVar17 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_e8.data + pSVar19 * 0x10))->_vptr__Sp_counted_base,
                                    uVar13,*(undefined8 *)(local_78.data + (long)pSVar20 * 8),pVVar1
                                    ,pSVar26);
                *(long *)(pdVar7 + (long)pSVar26 * 8) = lVar17;
                pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
              } while (count != pSVar26);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var11._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar12 = (local_78.sel)->sel_vector;
            pSVar26 = (SelectionVector *)0x0;
            do {
              pSVar19 = pSVar26;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var11._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar19 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var11._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar26 * 4);
              }
              pSVar20 = pSVar26;
              if (psVar12 != (sel_t *)0x0) {
                pSVar20 = (SelectionVector *)(ulong)psVar12[(long)pSVar26];
              }
              if (((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar19 >> 6] >> ((ulong)pSVar19 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar20 >> 6] >> ((ulong)pSVar20 & 0x3f) & 1) != 0)))) {
                uVar10._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar19 * 0x10))->_M_use_count;
                uVar10._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar19 * 0x10))->_M_weak_count;
                lVar17 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_e8.data + pSVar19 * 0x10))->_vptr__Sp_counted_base,
                                    uVar10,*(undefined8 *)(local_78.data + (long)pSVar20 * 8),pVVar1
                                    ,pSVar26);
                *(long *)(pdVar7 + (long)pSVar26 * 8) = lVar17;
              }
              else {
                _Var21._M_head_impl =
                     (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var21._M_head_impl == (unsigned_long *)0x0) {
                  local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_80);
                  p_Var16 = p_Stack_90;
                  peVar15 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar15;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var16;
                  if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
                     p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var21._M_head_impl =
                       (pTVar18->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var21._M_head_impl;
                }
                bVar14 = (byte)pSVar26 & 0x3f;
                _Var21._M_head_impl[(ulong)pSVar26 >> 6] =
                     _Var21._M_head_impl[(ulong)pSVar26 >> 6] &
                     (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
              }
              pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
            } while (count != pSVar26);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          return;
        }
        local_130 = vector->data;
        pdVar7 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar28 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar25 = local_e8.data;
          pSVar26 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar26;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar25;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(pVVar1,&vector_00->validity,(idx_t)count);
            _Var21._M_head_impl = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask
            ;
            goto LAB_01ad268d;
          }
        }
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          _Var21._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar25 = local_e8.data;
          pSVar26 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar26;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar25;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var21._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
LAB_01ad268d:
        if (_Var21._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            local_130 = local_130 + 8;
            pSVar26 = (SelectionVector *)0x0;
            do {
              lVar17 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                 (*(undefined8 *)(local_130 + -8),*(undefined8 *)local_130,
                                  *(undefined8 *)(pdVar7 + (long)pSVar26 * 8),pVVar1,pSVar26);
              *(long *)(pdVar28 + (long)pSVar26 * 8) = lVar17;
              pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
              local_130 = local_130 + 0x10;
            } while (count != pSVar26);
          }
        }
        else {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar2) {
            local_128 = 0;
            pSVar26 = (SelectionVector *)0x0;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_01ad2708:
                pSVar20 = pSVar26;
                if (pSVar26 < pSVar19) {
                  pdVar25 = local_130 + (long)pSVar26 * 0x10 + 8;
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25,
                                        *(undefined8 *)(pdVar7 + (long)pSVar26 * 8),pVVar1,pSVar26);
                    *(long *)(pdVar28 + (long)pSVar26 * 8) = lVar17;
                    pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
                    pdVar25 = pdVar25 + 0x10;
                    pSVar20 = pSVar19;
                  } while (pSVar19 != pSVar26);
                }
              }
              else {
                uVar22 = puVar5[local_128];
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar20 = pSVar19;
                if (uVar22 != 0) {
                  if (uVar22 == 0xffffffffffffffff) goto LAB_01ad2708;
                  pSVar20 = pSVar26;
                  if (pSVar26 < pSVar19) {
                    pdVar25 = local_130 + (long)pSVar26 * 0x10 + 8;
                    uVar27 = 0;
                    do {
                      if ((uVar22 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                           (*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25,
                                            *(undefined8 *)(pdVar7 + uVar27 * 8 + (long)pSVar26 * 8)
                                            ,pVVar1,(long)&pSVar26->sel_vector + uVar27);
                        *(long *)(pdVar28 + uVar27 * 8 + (long)pSVar26 * 8) = lVar17;
                      }
                      uVar27 = uVar27 + 1;
                      pdVar25 = pdVar25 + 0x10;
                      pSVar20 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar26 != uVar27);
                  }
                }
              }
              local_128 = local_128 + 1;
              pSVar26 = pSVar20;
            } while (local_128 != (ulong)puVar2 >> 6);
          }
        }
        return;
      }
      pdVar7 = vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar28 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar23 = local_e8.data;
          pSVar26 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar26;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar23;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar22 = 0;
            pSVar26 = (SelectionVector *)0x0;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_01ad2229:
                pSVar20 = pSVar26;
                if (pSVar26 < pSVar19) {
                  uVar10 = *(undefined8 *)pdVar7;
                  uVar13 = *(undefined8 *)(pdVar7 + 8);
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (uVar10,uVar13,*(undefined8 *)(pdVar28 + (long)pSVar26 * 8),
                                        pVVar1,pSVar26);
                    *(long *)(pdVar25 + (long)pSVar26 * 8) = lVar17;
                    pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
                    pSVar20 = pSVar19;
                  } while (pSVar19 != pSVar26);
                }
              }
              else {
                uVar27 = puVar5[uVar22];
                pSVar19 = (SelectionVector *)
                          &pSVar26[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar20 = pSVar19;
                if (uVar27 != 0) {
                  if (uVar27 == 0xffffffffffffffff) goto LAB_01ad2229;
                  pSVar20 = pSVar26;
                  if (pSVar26 < pSVar19) {
                    uVar24 = 0;
                    do {
                      if ((uVar27 >> (uVar24 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                           (*(undefined8 *)pdVar7,*(undefined8 *)(pdVar7 + 8),
                                            *(undefined8 *)
                                             (pdVar28 + uVar24 * 8 + (long)pSVar26 * 8),pVVar1,
                                            (long)&pSVar26->sel_vector + uVar24);
                        *(long *)(pdVar25 + uVar24 * 8 + (long)pSVar26 * 8) = lVar17;
                      }
                      uVar24 = uVar24 + 1;
                      pSVar20 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar26 != uVar24);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pSVar26 = pSVar20;
              if (uVar22 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar7;
        uVar13 = *(undefined8 *)(pdVar7 + 8);
        pSVar26 = (SelectionVector *)0x0;
        do {
          lVar17 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                             (uVar10,uVar13,*(undefined8 *)(pdVar28 + (long)pSVar26 * 8),pVVar1,
                              pSVar26);
          *(long *)(pdVar25 + (long)pSVar26 * 8) = lVar17;
          pSVar26 = (SelectionVector *)((long)&pSVar26->sel_vector + 1);
        } while (count != pSVar26);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}